

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  byte bVar17;
  char cVar18;
  undefined4 uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong *puVar27;
  ulong uVar28;
  vint4 ai_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 ai;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 ai_3;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 ai_2;
  undefined1 auVar36 [16];
  vint4 bi_7;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 bi_4;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 bi_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar32._4_4_ = fVar2;
  auVar32._0_4_ = fVar2;
  auVar32._8_4_ = fVar2;
  auVar32._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar34._4_4_ = fVar3;
  auVar34._0_4_ = fVar3;
  auVar34._8_4_ = fVar3;
  auVar34._12_4_ = fVar3;
  uVar4 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar5 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar50._4_4_ = fVar7;
  auVar50._0_4_ = fVar7;
  auVar50._8_4_ = fVar7;
  auVar50._12_4_ = fVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar37._4_4_ = fVar8;
  auVar37._0_4_ = fVar8;
  auVar37._8_4_ = fVar8;
  auVar37._12_4_ = fVar8;
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar39._4_4_ = fVar9;
  auVar39._0_4_ = fVar9;
  auVar39._8_4_ = fVar9;
  auVar39._12_4_ = fVar9;
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar10 = (tray->tnear).field_0.i[k];
  auVar43._4_4_ = iVar10;
  auVar43._0_4_ = iVar10;
  auVar43._8_4_ = iVar10;
  auVar43._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar41._4_4_ = iVar10;
  auVar41._0_4_ = iVar10;
  auVar41._8_4_ = iVar10;
  auVar41._12_4_ = iVar10;
  auVar44._0_4_ = fVar7 * -fVar1;
  auVar44._4_4_ = fVar7 * -fVar1;
  auVar44._8_4_ = fVar7 * -fVar1;
  auVar44._12_4_ = fVar7 * -fVar1;
  auVar46._0_4_ = fVar8 * -fVar2;
  auVar46._4_4_ = fVar8 * -fVar2;
  auVar46._8_4_ = fVar8 * -fVar2;
  auVar46._12_4_ = fVar8 * -fVar2;
  auVar47._0_4_ = fVar9 * -fVar3;
  auVar47._4_4_ = fVar9 * -fVar3;
  auVar47._8_4_ = fVar9 * -fVar3;
  auVar47._12_4_ = fVar9 * -fVar3;
  puVar27 = local_7d0;
LAB_01597a3e:
  puVar26 = puVar27;
  if (puVar26 == &local_7d8) {
LAB_01597dec:
    return puVar26 != &local_7d8;
  }
  puVar27 = puVar26 + -1;
  uVar23 = puVar26[-1];
LAB_01597a52:
  if ((uVar23 & 0xf) == 0) {
    auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar24),auVar44,auVar50);
    auVar13 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar28),auVar46,auVar37);
    auVar12 = vpmaxsd_avx(auVar12,auVar13);
    auVar13 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar25),auVar47,auVar39);
    auVar31 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + (uVar24 ^ 0x10)),auVar44,
                              auVar50);
    auVar42 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + (uVar28 ^ 0x10)),auVar46,
                              auVar37);
    auVar31 = vpminsd_avx(auVar31,auVar42);
    auVar42 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar23 + 0x20 + (uVar25 ^ 0x10)),auVar47,
                              auVar39);
    auVar13 = vpmaxsd_avx(auVar13,auVar43);
    auVar12 = vpmaxsd_avx(auVar12,auVar13);
    auVar13 = vpminsd_avx(auVar42,auVar41);
    auVar13 = vpminsd_avx(auVar31,auVar13);
    auVar12 = vpcmpgtd_avx(auVar12,auVar13);
    uVar19 = vmovmskps_avx(auVar12);
    bVar17 = (byte)uVar19 ^ 0xf;
  }
  else {
    if ((int)(uVar23 & 0xf) != 2) {
      cVar18 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar23 & 0xfffffffffffffff0) * 0x40 + 0x18))
                         (pre,ray,k,context);
      if (cVar18 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_01597dec;
      }
      goto LAB_01597a3e;
    }
    uVar20 = uVar23 & 0xfffffffffffffff0;
    auVar12 = *(undefined1 (*) [16])(uVar20 + 0x80);
    auVar42._0_4_ = fVar6 * auVar12._0_4_;
    auVar42._4_4_ = fVar6 * auVar12._4_4_;
    auVar42._8_4_ = fVar6 * auVar12._8_4_;
    auVar42._12_4_ = fVar6 * auVar12._12_4_;
    auVar13 = *(undefined1 (*) [16])(uVar20 + 0x90);
    auVar45._0_4_ = fVar6 * auVar13._0_4_;
    auVar45._4_4_ = fVar6 * auVar13._4_4_;
    auVar45._8_4_ = fVar6 * auVar13._8_4_;
    auVar45._12_4_ = fVar6 * auVar13._12_4_;
    auVar31 = *(undefined1 (*) [16])(uVar20 + 0xa0);
    auVar48._0_4_ = auVar31._0_4_ * fVar6;
    auVar48._4_4_ = auVar31._4_4_ * fVar6;
    auVar48._8_4_ = auVar31._8_4_ * fVar6;
    auVar48._12_4_ = auVar31._12_4_ * fVar6;
    auVar14._4_4_ = uVar5;
    auVar14._0_4_ = uVar5;
    auVar14._8_4_ = uVar5;
    auVar14._12_4_ = uVar5;
    auVar42 = vfmadd231ps_fma(auVar42,auVar14,*(undefined1 (*) [16])(uVar20 + 0x50));
    auVar45 = vfmadd231ps_fma(auVar45,auVar14,*(undefined1 (*) [16])(uVar20 + 0x60));
    auVar15._4_4_ = uVar4;
    auVar15._0_4_ = uVar4;
    auVar15._8_4_ = uVar4;
    auVar15._12_4_ = uVar4;
    auVar40 = vfmadd231ps_fma(auVar42,auVar15,*(undefined1 (*) [16])(uVar20 + 0x20));
    auVar38 = vfmadd231ps_fma(auVar45,auVar15,*(undefined1 (*) [16])(uVar20 + 0x30));
    auVar49._8_4_ = 0x7fffffff;
    auVar49._0_8_ = 0x7fffffff7fffffff;
    auVar49._12_4_ = 0x7fffffff;
    auVar42 = vandps_avx(auVar49,auVar40);
    auVar29._8_4_ = 0x219392ef;
    auVar29._0_8_ = 0x219392ef219392ef;
    auVar29._12_4_ = 0x219392ef;
    auVar42 = vcmpps_avx(auVar42,auVar29,1);
    auVar45 = vblendvps_avx(auVar40,auVar29,auVar42);
    auVar42 = vandps_avx(auVar38,auVar49);
    auVar42 = vcmpps_avx(auVar42,auVar29,1);
    auVar40 = vblendvps_avx(auVar38,auVar29,auVar42);
    auVar42 = vfmadd231ps_fma(auVar48,auVar14,*(undefined1 (*) [16])(uVar20 + 0x70));
    auVar38 = vfmadd231ps_fma(auVar42,auVar15,*(undefined1 (*) [16])(uVar20 + 0x40));
    auVar42 = vandps_avx(auVar38,auVar49);
    auVar42 = vcmpps_avx(auVar42,auVar29,1);
    auVar42 = vblendvps_avx(auVar38,auVar29,auVar42);
    auVar38 = vrcpps_avx(auVar45);
    auVar30._8_4_ = 0x3f800000;
    auVar30._0_8_ = 0x3f8000003f800000;
    auVar30._12_4_ = 0x3f800000;
    auVar45 = vfnmadd213ps_fma(auVar45,auVar38,auVar30);
    auVar38 = vfmadd132ps_fma(auVar45,auVar38,auVar38);
    auVar45 = vrcpps_avx(auVar40);
    auVar40 = vfnmadd213ps_fma(auVar40,auVar45,auVar30);
    auVar40 = vfmadd132ps_fma(auVar40,auVar45,auVar45);
    auVar45 = vrcpps_avx(auVar42);
    auVar42 = vfnmadd213ps_fma(auVar42,auVar45,auVar30);
    auVar42 = vfmadd132ps_fma(auVar42,auVar45,auVar45);
    auVar12 = vfmadd213ps_fma(auVar12,auVar34,*(undefined1 (*) [16])(uVar20 + 0xb0));
    auVar45 = vfmadd231ps_fma(auVar12,auVar32,*(undefined1 (*) [16])(uVar20 + 0x50));
    auVar12 = vfmadd213ps_fma(auVar13,auVar34,*(undefined1 (*) [16])(uVar20 + 0xc0));
    auVar13 = vfmadd213ps_fma(auVar31,auVar34,*(undefined1 (*) [16])(uVar20 + 0xd0));
    auVar12 = vfmadd231ps_fma(auVar12,auVar32,*(undefined1 (*) [16])(uVar20 + 0x60));
    auVar13 = vfmadd231ps_fma(auVar13,auVar32,*(undefined1 (*) [16])(uVar20 + 0x70));
    auVar16._4_4_ = fVar1;
    auVar16._0_4_ = fVar1;
    auVar16._8_4_ = fVar1;
    auVar16._12_4_ = fVar1;
    auVar31 = vfmadd231ps_fma(auVar45,auVar16,*(undefined1 (*) [16])(uVar20 + 0x20));
    auVar35._0_4_ = auVar31._0_4_ * -auVar38._0_4_;
    auVar35._4_4_ = auVar31._4_4_ * -auVar38._4_4_;
    auVar35._8_4_ = auVar31._8_4_ * -auVar38._8_4_;
    auVar35._12_4_ = auVar31._12_4_ * -auVar38._12_4_;
    auVar12 = vfmadd231ps_fma(auVar12,auVar16,*(undefined1 (*) [16])(uVar20 + 0x30));
    auVar33._0_4_ = auVar12._0_4_ * -auVar40._0_4_;
    auVar33._4_4_ = auVar12._4_4_ * -auVar40._4_4_;
    auVar33._8_4_ = auVar12._8_4_ * -auVar40._8_4_;
    auVar33._12_4_ = auVar12._12_4_ * -auVar40._12_4_;
    auVar12 = vfmadd231ps_fma(auVar13,auVar16,*(undefined1 (*) [16])(uVar20 + 0x40));
    auVar31._0_4_ = auVar12._0_4_ * -auVar42._0_4_;
    auVar31._4_4_ = auVar12._4_4_ * -auVar42._4_4_;
    auVar31._8_4_ = auVar12._8_4_ * -auVar42._8_4_;
    auVar31._12_4_ = auVar12._12_4_ * -auVar42._12_4_;
    auVar36._0_4_ = auVar38._0_4_ + auVar35._0_4_;
    auVar36._4_4_ = auVar38._4_4_ + auVar35._4_4_;
    auVar36._8_4_ = auVar38._8_4_ + auVar35._8_4_;
    auVar36._12_4_ = auVar38._12_4_ + auVar35._12_4_;
    auVar38._0_4_ = auVar40._0_4_ + auVar33._0_4_;
    auVar38._4_4_ = auVar40._4_4_ + auVar33._4_4_;
    auVar38._8_4_ = auVar40._8_4_ + auVar33._8_4_;
    auVar38._12_4_ = auVar40._12_4_ + auVar33._12_4_;
    auVar40._0_4_ = auVar42._0_4_ + auVar31._0_4_;
    auVar40._4_4_ = auVar42._4_4_ + auVar31._4_4_;
    auVar40._8_4_ = auVar42._8_4_ + auVar31._8_4_;
    auVar40._12_4_ = auVar42._12_4_ + auVar31._12_4_;
    auVar12 = vpminsd_avx(auVar33,auVar38);
    auVar13 = vpminsd_avx(auVar31,auVar40);
    auVar12 = vmaxps_avx(auVar12,auVar13);
    auVar45 = vpminsd_avx(auVar35,auVar36);
    auVar42 = vpmaxsd_avx(auVar35,auVar36);
    auVar13 = vpmaxsd_avx(auVar33,auVar38);
    auVar31 = vpmaxsd_avx(auVar31,auVar40);
    auVar31 = vminps_avx(auVar13,auVar31);
    auVar13 = vmaxps_avx(auVar43,auVar45);
    auVar12 = vmaxps_avx(auVar13,auVar12);
    auVar13 = vminps_avx(auVar41,auVar42);
    auVar13 = vminps_avx(auVar13,auVar31);
    auVar12 = vcmpps_avx(auVar12,auVar13,2);
    uVar19 = vmovmskps_avx(auVar12);
    bVar17 = (byte)uVar19;
  }
  if (bVar17 == 0) goto LAB_01597a3e;
  uVar20 = uVar23 & 0xfffffffffffffff0;
  lVar11 = 0;
  for (uVar23 = (ulong)bVar17; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    lVar11 = lVar11 + 1;
  }
  uVar23 = *(ulong *)(uVar20 + lVar11 * 8);
  uVar21 = bVar17 - 1 & (uint)bVar17;
  uVar22 = (ulong)uVar21;
  if (uVar21 != 0) {
    do {
      *puVar27 = uVar23;
      puVar27 = puVar27 + 1;
      lVar11 = 0;
      for (uVar23 = uVar22; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
        lVar11 = lVar11 + 1;
      }
      uVar22 = uVar22 - 1 & uVar22;
      uVar23 = *(ulong *)(uVar20 + lVar11 * 8);
    } while (uVar22 != 0);
  }
  goto LAB_01597a52;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }